

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitIdentifier(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  AsmJsFunc *pAVar1;
  code *pcVar2;
  EmitExpressionInfo EVar3;
  bool bVar4;
  SymbolType SVar5;
  uint uVar6;
  int C1;
  RegSlot RVar7;
  RegSlot RVar8;
  undefined4 *puVar9;
  AsmJsCompilationException *pAVar10;
  LPCOLESTR pOVar11;
  double *pdVar12;
  float val;
  double val_00;
  AsmJsType local_84;
  RegSlot local_80;
  AsmJsType local_7c;
  RegSlot loc;
  AsmJsMathConst *mathConst;
  AsmJsType local_68;
  AsmJsType local_64;
  AsmJsVarBase *local_60;
  AsmJsVarBase *var_1;
  AsmJsVar *local_50;
  AsmJsVar *var;
  AsmJsSymbol *local_38;
  AsmJsSymbol *sym;
  IdentPtr pIStack_28;
  Source source;
  PropertyName name;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo emitInfo;
  
  name = (PropertyName)pnode;
  pnode_local = (ParseNode *)this;
  bVar4 = ParserWrapper::IsNameDeclaration(pnode);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x575,"(ParserWrapper::IsNameDeclaration( pnode ))",
                                "ParserWrapper::IsNameDeclaration( pnode )");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pIStack_28 = ParseNode::name((ParseNode *)name);
  local_38 = AsmJsModuleCompiler::LookupIdentifier
                       (this->mCompiler,pIStack_28,this->mFunction,(Source *)((long)&sym + 4));
  if (local_38 == (AsmJsSymbol *)0x0) {
    pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    pOVar11 = Ident::Psz(pIStack_28);
    AsmJsCompilationException::AsmJsCompilationException(pAVar10,L"Undefined identifier %s",pOVar11)
    ;
    __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
  }
  SVar5 = AsmJsSymbol::GetSymbolType(local_38);
  switch(SVar5) {
  case Variable:
    local_50 = AsmJsVar::FromSymbol(local_38);
    uVar6 = (*(local_50->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol[1])();
    if ((uVar6 & 1) == 0) {
      if (sym._4_4_ != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x586,"(source == AsmJsLookupSource::AsmJsModule)",
                                    "source == AsmJsLookupSource::AsmJsModule");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      var_1._4_4_ = (**(local_50->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol)();
      EmitExpressionInfo::EmitExpressionInfo
                ((EmitExpressionInfo *)&this_local,(AsmJsType *)((long)&var_1 + 4));
      var_1._3_1_ = AsmJsVarBase::GetVarType(&local_50->super_AsmJsVarBase);
      bVar4 = AsmJsVarType::isInt((AsmJsVarType *)((long)&var_1 + 3));
      if (bVar4) {
        RVar7 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
        this_local._0_4_ = RVar7;
        C1 = AsmJsVar::GetIntInitialiser(local_50);
        AsmJsByteCodeWriter::AsmInt1Const1(&this->mWriter,Ld_IntConst,RVar7,C1);
      }
      else {
        var_1._2_1_ = AsmJsVarBase::GetVarType(&local_50->super_AsmJsVarBase);
        bVar4 = AsmJsVarType::isFloat((AsmJsVarType *)((long)&var_1 + 2));
        if (bVar4) {
          RVar7 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
          pAVar1 = this->mFunction;
          this_local._0_4_ = RVar7;
          val = AsmJsVar::GetFloatInitialiser(local_50);
          RVar8 = AsmJsFunc::GetConstRegister<float>(pAVar1,val);
          AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Ld_Flt,RVar7,RVar8);
        }
        else {
          var_1._1_1_ = AsmJsVarBase::GetVarType(&local_50->super_AsmJsVarBase);
          bVar4 = AsmJsVarType::isDouble((AsmJsVarType *)((long)&var_1 + 1));
          if (((bVar4 ^ 0xffU) & 1) != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                        ,0x595,"(var->GetVarType().isDouble())",
                                        "var->GetVarType().isDouble()");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          RVar7 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
          pAVar1 = this->mFunction;
          this_local._0_4_ = RVar7;
          val_00 = AsmJsVar::GetDoubleInitialiser(local_50);
          RVar8 = AsmJsFunc::GetConstRegister<double>(pAVar1,val_00);
          AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Ld_Db,RVar7,RVar8);
        }
      }
      break;
    }
  case Argument:
  case ConstantImport:
    local_60 = AsmJsVarBase::FromSymbol(local_38);
    if (sym._4_4_ == 1) {
      RVar7 = AsmJsVarBase::GetLocation(local_60);
      local_64.which_ = (**(local_60->super_AsmJsSymbol)._vptr_AsmJsSymbol)();
      EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,RVar7,&local_64);
    }
    else {
      if (sym._4_4_ != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x5a7,"(source == AsmJsLookupSource::AsmJsModule)",
                                    "source == AsmJsLookupSource::AsmJsModule");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      local_68.which_ = (**(local_60->super_AsmJsSymbol)._vptr_AsmJsSymbol)();
      EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,&local_68);
      mathConst._7_1_ = AsmJsVarBase::GetVarType(local_60);
      bVar4 = AsmJsVarType::isInt((AsmJsVarType *)((long)&mathConst + 7));
      if (bVar4) {
        RVar7 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
        this_local._0_4_ = RVar7;
        RVar8 = AsmJsVarBase::GetLocation(local_60);
        LoadModuleInt(this,RVar7,RVar8);
      }
      else {
        mathConst._6_1_ = AsmJsVarBase::GetVarType(local_60);
        bVar4 = AsmJsVarType::isFloat((AsmJsVarType *)((long)&mathConst + 6));
        if (bVar4) {
          RVar7 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
          this_local._0_4_ = RVar7;
          RVar8 = AsmJsVarBase::GetLocation(local_60);
          LoadModuleFloat(this,RVar7,RVar8);
        }
        else {
          mathConst._5_1_ = AsmJsVarBase::GetVarType(local_60);
          bVar4 = AsmJsVarType::isDouble((AsmJsVarType *)((long)&mathConst + 5));
          if (bVar4) {
            RVar7 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
            this_local._0_4_ = RVar7;
            RVar8 = AsmJsVarBase::GetLocation(local_60);
            LoadModuleDouble(this,RVar7,RVar8);
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                        ,0x5ba,"((0))","UNREACHED");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
        }
      }
    }
    break;
  case MathConstant:
    _loc = AsmJsMathConst::FromSymbol(local_38);
    local_7c.which_ = (**(_loc->super_AsmJsSymbol)._vptr_AsmJsSymbol)();
    bVar4 = AsmJsType::isDouble(&local_7c);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x5c3,"(mathConst->GetType().isDouble())",
                                  "mathConst->GetType().isDouble()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    RVar7 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
    pAVar1 = this->mFunction;
    local_80 = RVar7;
    pdVar12 = AsmJsMathConst::GetVal(_loc);
    RVar8 = AsmJsFunc::GetConstRegister<double>(pAVar1,*pdVar12);
    AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Ld_Db,RVar7,RVar8);
    RVar7 = local_80;
    AsmJsType::AsmJsType(&local_84,Double);
    EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,RVar7,&local_84);
    break;
  case ImportFunction:
  case FuncPtrTable:
  case ModuleFunction:
  case ArrayView:
  case MathBuiltinFunction:
  default:
    pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    pOVar11 = Ident::Psz(pIStack_28);
    AsmJsCompilationException::AsmJsCompilationException
              (pAVar10,L"Cannot use identifier %s in this context",pOVar11);
    __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
  }
  EVar3.type.which_ = this_local._4_4_;
  EVar3.super_EmitInfoBase.location = this_local._0_4_;
  return EVar3;
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitIdentifier( ParseNode * pnode )
    {
        Assert( ParserWrapper::IsNameDeclaration( pnode ) );
        PropertyName name = pnode->name();
        AsmJsLookupSource::Source source;
        AsmJsSymbol* sym = mCompiler->LookupIdentifier( name, mFunction, &source );
        if( !sym )
        {
            throw AsmJsCompilationException( _u("Undefined identifier %s"), name->Psz() );
        }

        switch( sym->GetSymbolType() )
        {
        case AsmJsSymbol::Variable:
        {
            AsmJsVar * var = AsmJsVar::FromSymbol(sym);
            if (!var->isMutable())
            {
                // currently const is only allowed for variables at module scope
                Assert(source == AsmJsLookupSource::AsmJsModule);

                EmitExpressionInfo emitInfo(var->GetType());
                if (var->GetVarType().isInt())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<int>();
                    mWriter.AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, emitInfo.location, var->GetIntInitialiser());
                }
                else if (var->GetVarType().isFloat())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<float>();
                    mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, emitInfo.location, mFunction->GetConstRegister<float>(var->GetFloatInitialiser()));
                }
                else
                {
                    Assert(var->GetVarType().isDouble());
                    emitInfo.location = mFunction->AcquireTmpRegister<double>();
                    mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Db, emitInfo.location, mFunction->GetConstRegister<double>(var->GetDoubleInitialiser()));
                }
                return emitInfo;
            }
            // else fall through
        }
        case AsmJsSymbol::Argument:
        case AsmJsSymbol::ConstantImport:
        {
            AsmJsVarBase* var = AsmJsVarBase::FromSymbol(sym);
            if( source == AsmJsLookupSource::AsmJsFunction )
            {
                return EmitExpressionInfo( var->GetLocation(), var->GetType() );
            }
            else
            {
                Assert( source == AsmJsLookupSource::AsmJsModule );
                EmitExpressionInfo emitInfo(var->GetType());
                if (var->GetVarType().isInt())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<int>();
                    LoadModuleInt(emitInfo.location, var->GetLocation());
                }
                else if (var->GetVarType().isFloat())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<float>();
                    LoadModuleFloat(emitInfo.location, var->GetLocation());
                }
                else if (var->GetVarType().isDouble())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<double>();
                    LoadModuleDouble(emitInfo.location, var->GetLocation());
                }
                else
                {
                    Assert(UNREACHED);
                }
                return emitInfo;
            }
            break;
        }
        case AsmJsSymbol::MathConstant:
        {
            AsmJsMathConst* mathConst = AsmJsMathConst::FromSymbol(sym);
            Assert(mathConst->GetType().isDouble());
            RegSlot loc = mFunction->AcquireTmpRegister<double>();
            mWriter.AsmReg2( OpCodeAsmJs::Ld_Db, loc, mFunction->GetConstRegister<double>(*mathConst->GetVal()) );
            return EmitExpressionInfo(loc, AsmJsType::Double);
        }

        case AsmJsSymbol::ImportFunction:
        case AsmJsSymbol::FuncPtrTable:
        case AsmJsSymbol::ModuleFunction:
        case AsmJsSymbol::ArrayView:
        case AsmJsSymbol::MathBuiltinFunction:
        default:
            throw AsmJsCompilationException( _u("Cannot use identifier %s in this context"), name->Psz() );
        }
    }